

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

_Bool ARM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  uint8_t *puVar1;
  cs_detail *__s;
  DecodeStatus DVar2;
  uint uVar3;
  void *Decoder;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t Address;
  uint uVar4;
  long lVar5;
  MCRegisterInfo *MRI;
  int feature;
  DecodeStatus DVar6;
  
  feature = (int)address;
  DVar6 = MCDisassembler_Fail;
  if (code_len < 4) goto LAB_001d6e25;
  __s = instr->flat_insn->detail;
  MRI = (MCRegisterInfo *)size;
  if (__s != (cs_detail *)0x0) {
    lVar5 = 0;
    memset(__s,0,0x740);
    do {
      puVar1 = instr->flat_insn->detail->groups + lVar5 + 0x35;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      instr->flat_insn->detail->groups[lVar5 + 0x5f] = 0xff;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x6c0);
  }
  if ((int)*(uint *)(ud + 4) < 0) {
    uVar4 = *(uint *)code;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  else {
    uVar4 = *(uint *)code;
  }
  DVar2 = decodeInstruction_4("\x01\x19\x03\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,feature);
  if (DVar2 == MCDisassembler_Fail) {
    MCInst_clear(instr);
    DVar2 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,feature)
    ;
    if (DVar2 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      DVar2 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,
                                  feature);
      if (DVar2 == MCDisassembler_Fail) {
        MCInst_clear(instr);
        Decoder = (void *)(ulong)*(uint *)(ud + 4);
        DVar2 = decodeInstruction_4("\x01\x04\x01\x02",instr,uVar4,(uint64_t)Decoder,MRI,feature);
        Address = extraout_RDX;
        if (DVar2 == MCDisassembler_Fail) {
          MCInst_clear(instr);
          Decoder = (void *)(ulong)*(uint *)(ud + 4);
          DVar2 = decodeInstruction_4("\x01\b\x04\x02",instr,uVar4,(uint64_t)Decoder,MRI,feature);
          Address = extraout_RDX_00;
          if (DVar2 == MCDisassembler_Fail) {
            MCInst_clear(instr);
            Decoder = (void *)(ulong)*(uint *)(ud + 4);
            DVar2 = decodeInstruction_4("\x01\x16\x06\x028i",instr,uVar4,(uint64_t)Decoder,MRI,
                                        feature);
            Address = extraout_RDX_01;
            if (DVar2 == MCDisassembler_Fail) {
              MCInst_clear(instr);
              DVar2 = decodeInstruction_4("\x01\b\x04\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,
                                          feature);
              if (DVar2 == MCDisassembler_Fail) {
                MCInst_clear(instr);
                DVar2 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),
                                            MRI,feature);
                if (DVar2 == MCDisassembler_Fail) {
                  MCInst_clear(instr);
                  *size = 0;
                  goto LAB_001d6e25;
                }
              }
              goto LAB_001d6e1a;
            }
          }
        }
        DVar6 = DVar2;
        *size = 4;
        DVar2 = DecodePredicateOperand(instr,0xe,Address,Decoder);
        if (DVar2 == MCDisassembler_Fail) {
          DVar6 = MCDisassembler_Fail;
        }
        goto LAB_001d6e25;
      }
    }
  }
  else {
    uVar3 = MCInst_getOpcode(instr);
    if ((0xefffffff < uVar4) && (uVar3 == 0x74)) goto LAB_001d6e25;
  }
LAB_001d6e1a:
  *size = 4;
  DVar6 = MCDisassembler_SoftFail;
LAB_001d6e25:
  return DVar6 != MCDisassembler_Fail;
}

Assistant:

bool ARM_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _ARM_getInstruction((cs_struct *)ud, instr, code, code_len, size, address);

	//return status == MCDisassembler_Success;
	return status != MCDisassembler_Fail;
}